

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O2

int32_t __thiscall
icu_63::UnicodeSetStringSpan::spanBack
          (UnicodeSetStringSpan *this,UChar *s,int32_t length,USetSpanCondition spanCondition)

{
  UnicodeSet *this_00;
  byte bVar1;
  short sVar2;
  uint8_t *puVar3;
  long lVar4;
  UBool *pUVar5;
  uint uVar6;
  UBool UVar7;
  uint length_00;
  int iVar8;
  int32_t iVar9;
  UnicodeString *pUVar10;
  char16_t *pcVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  uint local_c4;
  OffsetList offsets;
  
  if (spanCondition == USET_SPAN_NOT_CONTAINED) {
    iVar9 = spanNotBack(this,s,length);
    return iVar9;
  }
  this_00 = &this->spanSet;
  length_00 = UnicodeSet::spanBack(this_00,s,length,USET_SPAN_CONTAINED);
  if (length_00 == 0) {
    uVar21 = 0;
  }
  else {
    offsets.list = offsets.staticList;
    offsets.capacity = 0;
    offsets.length = 0;
    offsets.start = 0;
    if (spanCondition == USET_SPAN_CONTAINED) {
      OffsetList::setMaxLength(&offsets,this->maxLength16);
    }
    local_c4 = length - length_00;
    uVar21 = this->strings->count;
    uVar12 = 0;
    lVar14 = 0;
    if (this->all != '\0') {
      lVar14 = (long)(int)uVar21;
    }
    puVar3 = this->spanLengths;
    if (0 < (int)uVar21) {
      uVar12 = (ulong)uVar21;
    }
LAB_002cbeb3:
    do {
      if (spanCondition == USET_SPAN_CONTAINED) {
        for (uVar13 = 0; uVar13 != uVar12; uVar13 = uVar13 + 1) {
          bVar1 = puVar3[uVar13 + lVar14];
          uVar21 = (uint)bVar1;
          if (bVar1 != 0xff) {
            pUVar10 = (UnicodeString *)UVector::elementAt(this->strings,(int32_t)uVar13);
            pcVar11 = UnicodeString::getBuffer(pUVar10);
            sVar2 = (pUVar10->fUnion).fStackFields.fLengthAndFlags;
            if (sVar2 < 0) {
              iVar15 = (pUVar10->fUnion).fFields.fLength;
            }
            else {
              iVar15 = (int)sVar2 >> 5;
            }
            if (bVar1 == 0xfe) {
              uVar21 = 0xffffffff;
              if ((iVar15 != 1) && (uVar21 = 0xffffffff, (*pcVar11 & 0xfc00U) == 0xd800)) {
                uVar21 = ~(uint)((pcVar11[1] & 0xfc00U) == 0xdc00);
              }
              uVar21 = uVar21 + iVar15;
            }
            if ((int)local_c4 <= (int)uVar21) {
              uVar21 = local_c4;
            }
            iVar17 = iVar15 - uVar21;
            iVar18 = (length_00 + uVar21) - iVar15;
            for (lVar20 = 0; pUVar5 = offsets.list, uVar16 = (uint)lVar20,
                (int)(iVar17 + uVar16) <= (int)length_00; lVar20 = lVar20 + 1) {
              iVar8 = 0;
              if (offsets.capacity <= (int)(offsets.start + iVar17 + uVar16)) {
                iVar8 = offsets.capacity;
              }
              lVar4 = (long)iVar17 + ((long)offsets.start - (long)iVar8);
              if ((offsets.list[lVar20 + lVar4] == '\0') &&
                 (UVar7 = matches16CPB(s,iVar18,length,pcVar11,iVar15), UVar7 != '\0')) {
                if (((iVar15 - length_00) - uVar21) + uVar16 == 0) goto LAB_002cc21a;
                pUVar5[lVar20 + lVar4] = '\x01';
                offsets.length = offsets.length + 1;
              }
              if (uVar16 == uVar21) break;
              iVar18 = iVar18 + -1;
            }
          }
        }
LAB_002cc14c:
        if (length_00 == length || local_c4 != 0) {
          uVar21 = length_00;
          if (offsets.length == 0) break;
        }
        else {
          if (offsets.length == 0) {
            uVar21 = UnicodeSet::spanBack(this_00,s,length_00,USET_SPAN_CONTAINED);
            if (uVar21 != 0) {
              local_c4 = length_00 - uVar21;
              length_00 = uVar21;
              uVar16 = local_c4;
              goto joined_r0x002cc1f9;
            }
            break;
          }
          iVar9 = spanOneBack(this_00,s,length_00);
          if (0 < iVar9) {
            length_00 = length_00 - iVar9;
            if (length_00 == 0) {
LAB_002cc21a:
              uVar21 = 0;
              break;
            }
            OffsetList::shift(&offsets,iVar9);
            local_c4 = 0;
            goto LAB_002cbeb3;
          }
        }
        iVar9 = OffsetList::popMinimum(&offsets);
        length_00 = length_00 - iVar9;
        local_c4 = 0;
        goto LAB_002cbeb3;
      }
      iVar15 = 0;
      uVar21 = 0;
      for (uVar13 = 0; uVar13 != uVar12; uVar13 = uVar13 + 1) {
        bVar1 = puVar3[uVar13 + lVar14];
        pUVar10 = (UnicodeString *)UVector::elementAt(this->strings,(int32_t)uVar13);
        pcVar11 = UnicodeString::getBuffer(pUVar10);
        sVar2 = (pUVar10->fUnion).fStackFields.fLengthAndFlags;
        if (sVar2 < 0) {
          uVar16 = (pUVar10->fUnion).fFields.fLength;
        }
        else {
          uVar16 = (int)sVar2 >> 5;
        }
        uVar19 = (uint)bVar1;
        if (0xfd < bVar1) {
          uVar19 = uVar16;
        }
        if ((int)local_c4 <= (int)uVar19) {
          uVar19 = local_c4;
        }
        iVar17 = uVar16 - uVar19;
        while (((uVar6 = uVar21, iVar18 = iVar15, iVar17 <= (int)length_00 &&
                ((int)uVar21 <= (int)uVar19)) &&
               ((((int)uVar19 <= (int)uVar21 && (iVar17 <= iVar15)) ||
                (UVar7 = matches16CPB(s,(length_00 - uVar16) + uVar19,length,pcVar11,uVar16),
                uVar6 = uVar19, iVar18 = iVar17, UVar7 == '\0'))))) {
          uVar19 = uVar19 - 1;
          iVar17 = iVar17 + 1;
        }
        iVar15 = iVar18;
        uVar21 = uVar6;
      }
      if (uVar21 == 0 && iVar15 == 0) goto LAB_002cc14c;
      local_c4 = 0;
      uVar21 = 0;
      length_00 = length_00 - iVar15;
      uVar16 = length_00;
joined_r0x002cc1f9:
    } while (uVar16 != 0);
    OffsetList::~OffsetList(&offsets);
  }
  return uVar21;
}

Assistant:

int32_t UnicodeSetStringSpan::spanBack(const UChar *s, int32_t length, USetSpanCondition spanCondition) const {
    if(spanCondition==USET_SPAN_NOT_CONTAINED) {
        return spanNotBack(s, length);
    }
    int32_t pos=spanSet.spanBack(s, length, USET_SPAN_CONTAINED);
    if(pos==0) {
        return 0;
    }
    int32_t spanLength=length-pos;

    // Consider strings; they may overlap with the span.
    OffsetList offsets;
    if(spanCondition==USET_SPAN_CONTAINED) {
        // Use offset list to try all possibilities.
        offsets.setMaxLength(maxLength16);
    }
    int32_t i, stringsLength=strings.size();
    uint8_t *spanBackLengths=spanLengths;
    if(all) {
        spanBackLengths+=stringsLength;
    }
    for(;;) {
        if(spanCondition==USET_SPAN_CONTAINED) {
            for(i=0; i<stringsLength; ++i) {
                int32_t overlap=spanBackLengths[i];
                if(overlap==ALL_CP_CONTAINED) {
                    continue;  // Irrelevant string.
                }
                const UnicodeString &string=*(const UnicodeString *)strings.elementAt(i);
                const UChar *s16=string.getBuffer();
                int32_t length16=string.length();

                // Try to match this string at pos-(length16-overlap)..pos-length16.
                if(overlap>=LONG_SPAN) {
                    overlap=length16;
                    // While contained: No point matching fully inside the code point span.
                    int32_t len1=0;
                    U16_FWD_1(s16, len1, overlap);
                    overlap-=len1;  // Length of the string minus the first code point.
                }
                if(overlap>spanLength) {
                    overlap=spanLength;
                }
                int32_t dec=length16-overlap;  // Keep dec+overlap==length16.
                for(;;) {
                    if(dec>pos) {
                        break;
                    }
                    // Try to match if the decrement is not listed already.
                    if(!offsets.containsOffset(dec) && matches16CPB(s, pos-dec, length, s16, length16)) {
                        if(dec==pos) {
                            return 0;  // Reached the start of the string.
                        }
                        offsets.addOffset(dec);
                    }
                    if(overlap==0) {
                        break;
                    }
                    --overlap;
                    ++dec;
                }
            }
        } else /* USET_SPAN_SIMPLE */ {
            int32_t maxDec=0, maxOverlap=0;
            for(i=0; i<stringsLength; ++i) {
                int32_t overlap=spanBackLengths[i];
                // For longest match, we do need to try to match even an all-contained string
                // to find the match from the latest end.

                const UnicodeString &string=*(const UnicodeString *)strings.elementAt(i);
                const UChar *s16=string.getBuffer();
                int32_t length16=string.length();

                // Try to match this string at pos-(length16-overlap)..pos-length16.
                if(overlap>=LONG_SPAN) {
                    overlap=length16;
                    // Longest match: Need to match fully inside the code point span
                    // to find the match from the latest end.
                }
                if(overlap>spanLength) {
                    overlap=spanLength;
                }
                int32_t dec=length16-overlap;  // Keep dec+overlap==length16.
                for(;;) {
                    if(dec>pos || overlap<maxOverlap) {
                        break;
                    }
                    // Try to match if the string is longer or ends later.
                    if( (overlap>maxOverlap || /* redundant overlap==maxOverlap && */ dec>maxDec) &&
                        matches16CPB(s, pos-dec, length, s16, length16)
                    ) {
                        maxDec=dec;  // Longest match from latest end.
                        maxOverlap=overlap;
                        break;
                    }
                    --overlap;
                    ++dec;
                }
            }

            if(maxDec!=0 || maxOverlap!=0) {
                // Longest-match algorithm, and there was a string match.
                // Simply continue before it.
                pos-=maxDec;
                if(pos==0) {
                    return 0;  // Reached the start of the string.
                }
                spanLength=0;  // Match strings from before a string match.
                continue;
            }
        }
        // Finished trying to match all strings at pos.

        if(spanLength!=0 || pos==length) {
            // The position is before an unlimited code point span (spanLength!=0),
            // not before a string match.
            // The only position where spanLength==0 before a span is pos==length.
            // Otherwise, an unlimited code point span is only tried again when no
            // strings match, and if such a non-initial span fails we stop.
            if(offsets.isEmpty()) {
                return pos;  // No strings matched before a span.
            }
            // Match strings from before the next string match.
        } else {
            // The position is before a string match (or a single code point).
            if(offsets.isEmpty()) {
                // No more strings matched before a previous string match.
                // Try another code point span from before the last string match.
                int32_t oldPos=pos;
                pos=spanSet.spanBack(s, oldPos, USET_SPAN_CONTAINED);
                spanLength=oldPos-pos;
                if( pos==0 ||           // Reached the start of the string, or
                    spanLength==0       // neither strings nor span progressed.
                ) {
                    return pos;
                }
                continue;  // spanLength>0: Match strings from before a span.
            } else {
                // Try to match only one code point from before a string match if some
                // string matched beyond it, so that we try all possible positions
                // and don't overshoot.
                spanLength=spanOneBack(spanSet, s, pos);
                if(spanLength>0) {
                    if(spanLength==pos) {
                        return 0;  // Reached the start of the string.
                    }
                    // Match strings before this code point.
                    // There cannot be any decrements below it because UnicodeSet strings
                    // contain multiple code points.
                    pos-=spanLength;
                    offsets.shift(spanLength);
                    spanLength=0;
                    continue;  // Match strings from before a single code point.
                }
                // Match strings from before the next string match.
            }
        }
        pos-=offsets.popMinimum();
        spanLength=0;  // Match strings from before a string match.
    }
}